

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadUnits(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  element_type *peVar1;
  IssueImpl *pIVar2;
  bool bVar3;
  bool bVar4;
  XmlNodePtr childNode;
  IssuePtr issue_2;
  XmlAttributePtr attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  IssuePtr issue_1;
  string textNode;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  XmlNodePtr *local_30;
  
  local_30 = node;
  XmlNode::firstAttribute((XmlNode *)&attribute);
  bVar4 = false;
  while (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar3 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"name","");
    if (bVar3) {
      peVar1 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      XmlAttribute::value_abi_cxx11_
                (&textNode,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      NamedEntity::setName(&peVar1->super_NamedEntity,&textNode);
      std::__cxx11::string::~string((string *)&textNode);
      bVar4 = true;
    }
    else {
      bVar3 = isIdAttribute(&attribute,this->mParsing1XVersion);
      if (bVar3) {
        peVar1 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Entity::setId((Entity *)peVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
      }
      else {
        Issue::IssueImpl::create();
        pIVar2 = (IssueImpl *)
                 childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 [1].mPimpl;
        if (this->mParsing1XVersion == true) {
          NamedEntity::name_abi_cxx11_
                    (&local_70,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::operator+(&local_50,"Units \'",&local_70);
          std::operator+(&local_f0,&local_50,"\' ignoring attribute \'");
          XmlAttribute::name_abi_cxx11_
                    (&local_90,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_f0,&local_90);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar2,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          Issue::IssueImpl::setLevel
                    ((IssueImpl *)
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1].mPimpl,MESSAGE);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    (&local_70,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::operator+(&local_50,"Units \'",&local_70);
          std::operator+(&local_f0,&local_50,"\' has an invalid attribute \'");
          XmlAttribute::name_abi_cxx11_
                    (&local_90,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_f0,&local_90);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar2,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1].mPimpl,UNITS_ELEMENT);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((AnyCellmlElementImpl *)
                   (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr[1].mPimpl[5].mXmlNodePtr)->_private,units);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&childNode);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    XmlAttribute::next((XmlAttribute *)&textNode);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  if (!bVar4) {
    Issue::IssueImpl::create();
    pIVar2 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&textNode,"Units does not specify a name attribute.",
               (allocator<char> *)&local_f0);
    Issue::IssueImpl::setDescription(pIVar2,&textNode);
    std::__cxx11::string::~string((string *)&textNode);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,units);
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,UNITS_NAME);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  XmlNode::firstChild((XmlNode *)&childNode);
  while (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar4 = parseNode(this,(XmlNodePtr *)
                           &childNode.
                            super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                      "unit");
    if (bVar4) {
      loadUnit(this,units,
               (XmlNodePtr *)
               &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      bVar4 = XmlNode::isText(childNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (bVar4) {
        XmlNode::convertToString_abi_cxx11_
                  (&textNode,
                   childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        bVar4 = hasNonWhitespaceCharacters(&textNode);
        if (bVar4) {
          Issue::IssueImpl::create();
          pIVar2 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_90,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::operator+(&local_70,"Units \'",&local_90);
          std::operator+(&local_50,&local_70,
                         "\' has an invalid non-whitespace child text element \'");
          std::operator+(&local_f0,&local_50,&textNode);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_f0,"\'.");
          Issue::IssueImpl::setDescription
                    (pIVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &issue_1);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,units);
          Issue::IssueImpl::setReferenceRule
                    ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&textNode);
      }
      else {
        bVar4 = XmlNode::isComment(childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (!bVar4) {
          Issue::IssueImpl::create();
          pIVar2 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_70,
                     &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          std::operator+(&local_50,"Units \'",&local_70);
          std::operator+(&local_f0,&local_50,"\' has an invalid child element \'");
          XmlNode::name_abi_cxx11_
                    (&local_90,
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_f0,&local_90);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar2,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,units);
          Issue::IssueImpl::setReferenceRule
                    ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_UNEXPECTED_ELEMENT);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    XmlNode::next((XmlNode *)&textNode);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Parser::ParserImpl::loadUnits(const UnitsPtr &units, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            units->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            units->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Units '" + units->name() + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units does not specify a name attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (parseNode(childNode, "unit")) {
            loadUnit(units, childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}